

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O2

void __thiscall Reset_resetValueSetClear_Test::TestBody(Reset_resetValueSetClear_Test *this)

{
  char *pcVar1;
  AssertHelper local_130 [8];
  AssertionResult gtest_ar_2;
  ResetPtr r;
  string out1;
  AssertHelper local_e8 [8];
  string out2;
  string out3;
  ModelPtr m;
  PrinterPtr p;
  VariablePtr v2;
  ComponentPtr c;
  VariablePtr v1;
  string test2;
  string test1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test1,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component>\n    <reset variable=\"A\" test_variable=\"B\" order=\"1\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)&test2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test2,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component>\n    <reset variable=\"A\" test_variable=\"B\" order=\"1\">\n      <reset_value>\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\"/>\n      </reset_value>\n    </reset>\n  </component>\n</model>\n"
             ,(allocator<char> *)&out1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out1,"",(allocator<char> *)&out3);
  pcVar1 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&out2,"",(allocator<char> *)&c);
  createModelWithComponent((string *)&m,(string *)&out1);
  std::__cxx11::string::~string((string *)&out2);
  std::__cxx11::string::~string((string *)&out1);
  libcellml::ComponentEntity::component((ulong)&c);
  libcellml::Reset::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Printer::create();
  std::__cxx11::string::string<std::allocator<char>>((string *)&out1,"A",(allocator<char> *)&out2);
  libcellml::NamedEntity::setName
            ((string *)v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)&out1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out1,"B",(allocator<char> *)&out2);
  libcellml::NamedEntity::setName
            ((string *)v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)&out1);
  libcellml::Reset::setVariable
            ((shared_ptr *)r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Reset::setTestVariable
            ((shared_ptr *)r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Reset::setOrder
            ((int)r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addReset
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&out1,
             (bool)p.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
            );
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&out2,"test1","out1",&test1,&out1);
  if ((char)out2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&out3);
    if (out2._M_string_length != 0) {
      pcVar1 = *(char **)out2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x21d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&out3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&out3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&out2._M_string_length);
  libcellml::Reset::setResetValue
            ((string *)r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&out2,
             (bool)p.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
            );
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&out3,"test2","out2",&test2,&out2);
  if ((char)out3._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (out3._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)out3._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x222,pcVar1);
    testing::internal::AssertHelper::operator=(local_130,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&out3._M_string_length);
  libcellml::Reset::removeResetValue();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&out3,
             (bool)p.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
            );
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"test1","out3",&test1,&out3);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)local_130);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x227,pcVar1);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)local_130);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&out3);
  std::__cxx11::string::~string((string *)&out2);
  std::__cxx11::string::~string((string *)&out1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&test2);
  std::__cxx11::string::~string((string *)&test1);
  return;
}

Assistant:

TEST(Reset, resetValueSetClear)
{
    const std::string test1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <reset variable=\"A\" test_variable=\"B\" order=\"1\"/>\n"
        "  </component>\n"
        "</model>\n";

    const std::string test2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <reset variable=\"A\" test_variable=\"B\" order=\"1\">\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\"/>\n"
        "      </reset_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::ResetPtr r = libcellml::Reset::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::PrinterPtr p = libcellml::Printer::create();

    v1->setName("A");
    v2->setName("B");

    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(1);
    c->addReset(r);

    const std::string out1 = p->printModel(m);
    EXPECT_EQ(test1, out1);

    // Test setting of reset_value block.
    r->setResetValue(EMPTY_MATH);
    const std::string out2 = p->printModel(m);
    EXPECT_EQ(test2, out2);

    // Test clearing of reset_value block.
    r->removeResetValue();
    const std::string out3 = p->printModel(m);
    EXPECT_EQ(test1, out3);
}